

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
FBX::Decoder::decompress<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,Decoder *this,
          Span<char> *source)

{
  int iVar1;
  void *__s;
  runtime_error *this_00;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  value_type_conflict *__val;
  long lVar6;
  char *local_a0;
  undefined4 local_98;
  void *local_88;
  int local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = operator_new(1000000);
  memset(__s,0,1000000);
  local_98 = 0;
  local_a0 = (char *)0x0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  iVar1 = inflateInit_(&local_a0,"1.2.11",0x70);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Failed to initialize inflate");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = 0;
  do {
    uVar2 = (long)source->end - (long)source->begin;
    uVar4 = uVar2 - lVar3;
    if (lVar3 + 1000000U <= uVar2) {
      uVar4 = 1000000;
    }
    local_98 = (undefined4)uVar4;
    local_a0 = source->begin + lVar3;
    lVar3 = lVar3 + uVar4;
    do {
      local_80 = 1000000;
      local_88 = __s;
      iVar1 = inflate(&local_a0,0);
      uVar5 = 1000000 - local_80;
      if (uVar5 < uVar4) {
        __assert_fail("toConsume <= have",
                      "/workspace/llm4binary/github/license_c_cmakelists/WinteryFox[P]FBXImport/importer/src/Decoder.cpp"
                      ,99,
                      "std::vector<T> FBX::Decoder::decompress(const Span<char> &) const [T = long]"
                     );
      }
      lVar6 = (long)(__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      std::vector<long,_std::allocator<long>_>::resize
                (__return_storage_ptr__,(ulong)(uVar5 >> 3) + (lVar6 >> 3));
      memcpy((__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar6,__s,(ulong)uVar5);
    } while (local_80 == 0);
  } while (iVar1 != 1);
  inflateEnd(&local_a0);
  operator_delete(__s,1000000);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Decoder::decompress(const Span<char> &source) const {
        std::vector<T> buffer;
        std::vector<char> out(FBX_CHUNK);

        z_stream infstream;
        infstream.zalloc = Z_NULL;
        infstream.zfree = Z_NULL;
        infstream.opaque = Z_NULL;
        infstream.avail_in = 0;
        infstream.next_in = Z_NULL;

        if (inflateInit(&infstream) != Z_OK) {
            throw std::runtime_error("Failed to initialize inflate");
        }

        int ret;
        size_t consumed = 0;
        do {
            size_t toConsume;
            if (consumed + FBX_CHUNK > source.size())
                toConsume = source.size() - consumed;
            else
                toConsume = FBX_CHUNK;

            infstream.avail_in = toConsume;
            infstream.next_in = (Bytef *) source.begin + consumed;
            consumed += toConsume;

            do {
                infstream.avail_out = FBX_CHUNK;
                infstream.next_out = (Bytef *) out.data();

                ret = inflate(&infstream, Z_NO_FLUSH);

                size_t have = FBX_CHUNK - infstream.avail_out;
                size_t size = buffer.size() * sizeof(T);

                assert(toConsume <= have); // TODO: Fix buffer overflow for large chunks to inflate

                buffer.resize(buffer.size() + have / sizeof(T));
                std::memcpy(buffer.data() + size, out.data(), have);
            } while (infstream.avail_out == 0);
        } while (ret != Z_STREAM_END);
        inflateEnd(&infstream);
        return buffer;
    }